

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O0

void __thiscall
wallmon::update_stats(wallmon *this,vector<int,_std::allocator<int>_> *pids,string *read_path)

{
  byte bVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  pair<int,_unsigned_long_long> pVar3;
  float uptime_sec;
  ifstream proc_uptime;
  pid_t in_stack_0000030c;
  wallmon *in_stack_00000310;
  pair<int,_unsigned_long_long> code_and_time;
  string *in_stack_fffffffffffffca8;
  MessageBase *in_stack_fffffffffffffcb0;
  key_type *in_stack_fffffffffffffcc8;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  allocator local_2e1;
  mon_value in_stack_fffffffffffffd20;
  monitored_value *in_stack_fffffffffffffd28;
  allocator local_2b9;
  string local_2b8 [36];
  float local_294;
  long local_290 [42];
  mon_value in_stack_fffffffffffffec0;
  monitored_value *in_stack_fffffffffffffec8;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  int local_28;
  unsigned_long_long local_20;
  vector<int,_std::allocator<int>_> *local_10;
  
  if (((*(byte *)(in_RDI + 0x68) & 1) == 0) &&
     (local_10 = in_RSI, sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI), sVar2 != 0))
  {
    std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    pVar3 = get_mother_starttime(in_stack_00000310,in_stack_0000030c);
    local_20 = pVar3.second;
    local_28 = pVar3.first;
    if (local_28 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Error while reading mother starttime",&local_49);
      MessageBase::warning(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      return;
    }
    *(undefined1 *)(in_RDI + 0x68) = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"wtime",&local_81);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
          *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8)
    ;
    sysconf(2);
    prmon::monitored_value::set_offset(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::ifstream::ifstream((istream *)local_290,"/proc/uptime",_S_in);
  local_294 = 0.0;
  std::istream::operator>>((istream *)local_290,&local_294);
  bVar1 = std::ios::operator!((ios *)((long)local_290 + *(long *)(local_290[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffd20,"wtime",&local_2e1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
          *)CONCAT17(bVar1,in_stack_fffffffffffffcd0),in_stack_fffffffffffffcc8);
    prmon::monitored_value::set_value(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  }
  else {
    paVar4 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"Error while reading /proc/uptime",paVar4);
    MessageBase::warning(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  std::ifstream::~ifstream(local_290);
  return;
}

Assistant:

void wallmon::update_stats(const std::vector<pid_t>& pids,
                           const std::string read_path) {
  if (!got_mother_starttime && pids.size() > 0) {
    auto code_and_time = get_mother_starttime(pids[0]);
    if (code_and_time.first) {
      warning("Error while reading mother starttime");
      return;
    } else {
      got_mother_starttime = true;
      walltime_stats.at("wtime").set_offset(code_and_time.second /
                                            sysconf(_SC_CLK_TCK));
    }
  }

  std::ifstream proc_uptime{"/proc/uptime"};
  float uptime_sec{};
  proc_uptime >> uptime_sec;
  if (!proc_uptime) {
    warning("Error while reading /proc/uptime");
    return;
  }

  walltime_stats.at("wtime").set_value(uptime_sec);
}